

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall iu_Matcher_x_iutest_x_ResultOf_Test::Body(iu_Matcher_x_iutest_x_ResultOf_Test *this)

{
  bool bVar1;
  detail *pdVar2;
  string *in_RCX;
  AssertionResult *in_R8;
  int local_4c4;
  string local_4c0;
  string local_4a0;
  AssertionHelper local_480;
  Fixed local_450;
  int local_2c8 [2];
  GtMatcher<int> local_2c0;
  ResultOfMatcher<int_(int),_iutest::detail::GtMatcher<int>_> local_2b0;
  undefined1 local_290 [8];
  AssertionResult iutest_ar_1;
  string local_260;
  string local_240;
  AssertionHelper local_220;
  Fixed local_1f0;
  int local_58;
  undefined4 local_54;
  ResultOfMatcher<int_(int),_int> local_50;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Matcher_x_iutest_x_ResultOf_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_54 = 2;
  iutest::matchers::ResultOf<int(int),int>
            (&local_50,(matchers *)anon_unknown.dwarf_5a076::X2,(_func_int_int *)&local_54,
             (int *)in_RCX);
  local_58 = 1;
  iutest::detail::ResultOfMatcher<int(int),int>::operator()
            ((AssertionResult *)local_38,(ResultOfMatcher<int(int),int> *)&local_50,&local_58);
  iutest::detail::ResultOfMatcher<int_(int),_int>::~ResultOfMatcher(&local_50);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
    iutest_ar_1._36_4_ = 1;
    iutest::PrintToString<int>(&local_260,(int *)&iutest_ar_1.field_0x24);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_240,pdVar2,"ResultOf(X2, 2)",local_38,in_R8);
    in_RCX = &local_240;
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x179,in_RCX,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_220,&local_1f0);
    iutest::AssertionHelper::~AssertionHelper(&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_2c8[1] = 1;
  iutest::matchers::Gt<int>((matchers *)&local_2c0,local_2c8 + 1);
  iutest::matchers::ResultOf<int(int),iutest::detail::GtMatcher<int>>
            (&local_2b0,(matchers *)anon_unknown.dwarf_5a076::X2,(_func_int_int *)&local_2c0,
             (GtMatcher<int> *)in_RCX);
  local_2c8[0] = 1;
  iutest::detail::ResultOfMatcher<int(int),iutest::detail::GtMatcher<int>>::operator()
            ((AssertionResult *)local_290,
             (ResultOfMatcher<int(int),iutest::detail::GtMatcher<int>> *)&local_2b0,local_2c8);
  iutest::detail::ResultOfMatcher<int_(int),_iutest::detail::GtMatcher<int>_>::~ResultOfMatcher
            (&local_2b0);
  iutest::detail::GtMatcher<int>::~GtMatcher(&local_2c0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    memset(&local_450,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_450);
    local_4c4 = 1;
    iutest::PrintToString<int>(&local_4c0,&local_4c4);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_4a0,pdVar2,"ResultOf(X2, Gt(1))",local_290,in_R8);
    iutest::AssertionHelper::AssertionHelper
              (&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x17a,&local_4a0,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_480,&local_450);
    iutest::AssertionHelper::~AssertionHelper(&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_450);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  return;
}

Assistant:

IUTEST(Matcher, ResultOf)
{
    IUTEST_EXPECT_THAT(1, ResultOf(X2, 2));
    IUTEST_EXPECT_THAT(1, ResultOf(X2, Gt(1)));
}